

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

uint Extra_CountCofactorMinterms(DdManager *dd,DdNode *bFunc,DdNode *bVarsCof,DdNode *bVarsAll)

{
  DdHalfWord DVar1;
  DdHalfWord DVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdHalfWord local_80;
  DdHalfWord local_7c;
  int LevelTop;
  int LevelA;
  int LevelC;
  int LevelF;
  uint Res;
  DdNode *bVarsCofR;
  DdNode *bVarsCof1;
  DdNode *bVarsCof0;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bFuncR;
  uint HKey;
  DdNode *bVarsAll_local;
  DdNode *bVarsCof_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  pDVar4 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  bFuncR._4_4_ = (uint)(((ulong)s_Signature + (long)bFunc * 0xc00005) % 0xc7a9);
  while (HHTable1[bFuncR._4_4_].Sign == s_Signature) {
    if (HHTable1[bFuncR._4_4_].Arg1 == bFunc) {
      return 0;
    }
    bFuncR._4_4_ = (bFuncR._4_4_ + 1) % 0xc7a9;
  }
  if (dd->perm[pDVar4->index] < s_EncodingVarsLevel) {
    pDVar5 = (DdNode *)((ulong)bVarsCof & 0xfffffffffffffffe);
    DVar1 = dd->perm[pDVar4->index];
    if (pDVar5->index == 0x7fffffff) {
      local_80 = pDVar5->index;
    }
    else {
      local_80 = dd->perm[pDVar5->index];
    }
    DVar2 = dd->perm[bVarsAll->index];
    local_7c = DVar1;
    if ((int)local_80 < (int)DVar1) {
      local_7c = local_80;
    }
    if ((int)DVar2 < (int)local_7c) {
      local_7c = DVar2;
    }
    if (((local_7c == DVar1) || (local_7c == local_80)) && (local_7c != DVar2)) {
      __assert_fail("!( LevelTop == LevelF || LevelTop == LevelC ) || LevelTop == LevelA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                    ,0x3d1,
                    "unsigned int Extra_CountCofactorMinterms(DdManager *, DdNode *, DdNode *, DdNode *)"
                   );
    }
    bVarsCof0 = bFunc;
    bFunc1 = bFunc;
    if (local_7c == DVar1) {
      if (pDVar4 == bFunc) {
        bFunc1 = (pDVar4->type).kids.E;
        bVarsCof0 = (pDVar4->type).kids.T;
      }
      else {
        bFunc1 = (DdNode *)((ulong)(pDVar4->type).kids.E ^ 1);
        bVarsCof0 = (DdNode *)((ulong)(pDVar4->type).kids.T ^ 1);
      }
    }
    bVarsCofR = bVarsCof;
    bVarsCof1 = bVarsCof;
    if (local_7c == local_80) {
      if (pDVar5 == bVarsCof) {
        bVarsCof1 = (pDVar5->type).kids.E;
        bVarsCofR = (pDVar5->type).kids.T;
      }
      else {
        bVarsCof1 = (DdNode *)((ulong)(pDVar5->type).kids.E ^ 1);
        bVarsCofR = (DdNode *)((ulong)(pDVar5->type).kids.T ^ 1);
      }
    }
    LevelC = 0;
    if (local_7c == local_80) {
      if (bVarsCofR == (DdNode *)((ulong)dd->one ^ 1)) {
        if (bFunc1 != (DdNode *)((ulong)dd->one ^ 1)) {
          LevelC = Extra_CountCofactorMinterms(dd,bFunc1,bVarsCof1,(bVarsAll->type).kids.T);
        }
      }
      else if (bVarsCof0 != (DdNode *)((ulong)dd->one ^ 1)) {
        LevelC = Extra_CountCofactorMinterms(dd,bVarsCof0,bVarsCofR,(bVarsAll->type).kids.T);
      }
    }
    else {
      if (bFunc1 != (DdNode *)((ulong)dd->one ^ 1)) {
        LevelC = Extra_CountCofactorMinterms(dd,bFunc1,bVarsCof1,(bVarsAll->type).kids.T);
      }
      if (bVarsCof0 != (DdNode *)((ulong)dd->one ^ 1)) {
        uVar3 = Extra_CountCofactorMinterms(dd,bVarsCof0,bVarsCofR,(bVarsAll->type).kids.T);
        LevelC = uVar3 + LevelC;
      }
    }
    while (HHTable1[bFuncR._4_4_].Sign == s_Signature) {
      bFuncR._4_4_ = (bFuncR._4_4_ + 1) % 0xc7a9;
    }
    if (HHTable1[bFuncR._4_4_].Sign == s_Signature) {
      __assert_fail("HHTable1[HKey].Sign != s_Signature",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                    ,0x419,
                    "unsigned int Extra_CountCofactorMinterms(DdManager *, DdNode *, DdNode *, DdNode *)"
                   );
    }
    HHTable1[bFuncR._4_4_].Sign = s_Signature;
    HHTable1[bFuncR._4_4_].Arg1 = bFunc;
    dd_local._4_4_ = LevelC;
  }
  else {
    if (HHTable1[bFuncR._4_4_].Sign == s_Signature) {
      __assert_fail("HHTable1[HKey].Sign != s_Signature",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                    ,0x3b5,
                    "unsigned int Extra_CountCofactorMinterms(DdManager *, DdNode *, DdNode *, DdNode *)"
                   );
    }
    HHTable1[bFuncR._4_4_].Sign = s_Signature;
    HHTable1[bFuncR._4_4_].Arg1 = bFunc;
    dd_local._4_4_ = Extra_CountMintermsSimple(bFunc,1 << ((byte)s_MultiStart & 0x1f));
  }
  return dd_local._4_4_;
}

Assistant:

unsigned Extra_CountCofactorMinterms( DdManager * dd, DdNode * bFunc, DdNode * bVarsCof, DdNode * bVarsAll )
// this function computes how many minterms depending on the encoding variables
// are there in the cofactor of bFunc w.r.t. variables bVarsCof
// bFunc is assumed to depend on variables s_VarsAll
// the variables s_VarsAll should be ordered above the encoding variables
{
    unsigned HKey;
    DdNode * bFuncR;

    // if the function is zero, there are no minterms
//  if ( bFunc == b0 )
//      return 0;

//  if ( st__lookup(Visited, (char*)bFunc, NULL) )
//      return 0;

//  HKey = hashKey2c( s_Signature, bFuncR );
//  if ( HHTable1[HKey].Sign == s_Signature && HHTable1[HKey].Arg1 == bFuncR ) // this node is visited
//      return 0;


    // check the hash-table 
    bFuncR = Cudd_Regular(bFunc);
//  HKey = hashKey2( s_Signature, bFuncR, _TABLESIZE_COF );
    HKey = hashKey2( s_Signature, bFunc, _TABLESIZE_COF );
    for ( ;  HHTable1[HKey].Sign == s_Signature; HKey = (HKey+1) % _TABLESIZE_COF )
//      if ( HHTable1[HKey].Arg1 == bFuncR ) // this node is visited
        if ( HHTable1[HKey].Arg1 == bFunc ) // this node is visited
            return 0;


    // if the function is already the code
    if ( dd->perm[bFuncR->index] >= s_EncodingVarsLevel )
    {
//      st__insert(Visited, (char*)bFunc, NULL);

//      HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;

        assert( HHTable1[HKey].Sign != s_Signature );
        HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;
        HHTable1[HKey].Arg1 = bFunc;

        return Extra_CountMintermsSimple( bFunc, (1<<s_MultiStart) );
    }
    else
    {
        DdNode * bFunc0,    * bFunc1;
        DdNode * bVarsCof0, * bVarsCof1;
        DdNode * bVarsCofR = Cudd_Regular(bVarsCof);
        unsigned Res;

        // get the levels
        int LevelF = dd->perm[bFuncR->index];
        int LevelC = cuddI(dd,bVarsCofR->index);
        int LevelA = dd->perm[bVarsAll->index];

        int LevelTop = LevelF;

        if ( LevelTop > LevelC )
             LevelTop = LevelC;

        if ( LevelTop > LevelA )
             LevelTop = LevelA;

        // the top var in the function or in cofactoring vars always belongs to the set of all vars
        assert( !( LevelTop == LevelF || LevelTop == LevelC ) || LevelTop == LevelA );

        // cofactor the function
        if ( LevelTop == LevelF )
        {
            if ( bFuncR != bFunc ) // bFunc is complemented 
            {
                bFunc0 = Cudd_Not( cuddE(bFuncR) );
                bFunc1 = Cudd_Not( cuddT(bFuncR) );
            }
            else
            {
                bFunc0 = cuddE(bFuncR);
                bFunc1 = cuddT(bFuncR);
            }
        }
        else // bVars is higher in the variable order 
            bFunc0 = bFunc1 = bFunc;

        // cofactor the cube
        if ( LevelTop == LevelC )
        {
            if ( bVarsCofR != bVarsCof ) // bFunc is complemented 
            {
                bVarsCof0 = Cudd_Not( cuddE(bVarsCofR) );
                bVarsCof1 = Cudd_Not( cuddT(bVarsCofR) );
            }
            else
            {
                bVarsCof0 = cuddE(bVarsCofR);
                bVarsCof1 = cuddT(bVarsCofR);
            }
        }
        else // bVars is higher in the variable order 
            bVarsCof0 = bVarsCof1 = bVarsCof;

        // there are two cases: 
        // (1) the top variable belongs to the cofactoring variables
        // (2) the top variable does not belong to the cofactoring variables

        // (1) the top variable belongs to the cofactoring variables
        Res = 0;
        if ( LevelTop == LevelC )
        {
            if ( bVarsCof1 == b0 ) // this is a negative cofactor
            {
                if ( bFunc0 != b0 )
                Res = Extra_CountCofactorMinterms( dd, bFunc0, bVarsCof0, cuddT(bVarsAll) );
            }
            else                        // this is a positive cofactor
            {
                if ( bFunc1 != b0 )
                Res = Extra_CountCofactorMinterms( dd, bFunc1, bVarsCof1, cuddT(bVarsAll) );
            }
        }
        else
        {
            if ( bFunc0 != b0 )
            Res += Extra_CountCofactorMinterms( dd, bFunc0, bVarsCof0, cuddT(bVarsAll) );
            
            if ( bFunc1 != b0 )
            Res += Extra_CountCofactorMinterms( dd, bFunc1, bVarsCof1, cuddT(bVarsAll) );
        }

//      st__insert(Visited, (char*)bFunc, NULL);

//      HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;

        // skip through the entries with the same signatures 
        // (these might have been created at the time of recursive calls)
        for ( ; HHTable1[HKey].Sign == s_Signature; HKey = (HKey+1) % _TABLESIZE_COF );
        assert( HHTable1[HKey].Sign != s_Signature );
        HHTable1[HKey].Sign = s_Signature;
//      HHTable1[HKey].Arg1 = bFuncR;
        HHTable1[HKey].Arg1 = bFunc;

        return Res;
    }
}